

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O3

int amqpvalue_get_map_key_value_pair
              (AMQP_VALUE map,uint32_t index,AMQP_VALUE *key,AMQP_VALUE *value)

{
  AMQP_VALUE pAVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  
  if ((key == (AMQP_VALUE *)0x0 || map == (AMQP_VALUE)0x0) || value == (AMQP_VALUE *)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar4 = 0x6d6;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x6d6;
    }
    pcVar5 = "Bad arguments: map = %p, key = %p, value = %p";
    iVar3 = 0x6d5;
  }
  else if (map->type == AMQP_TYPE_MAP) {
    if (index < (map->value).binary_value.length) {
      pAVar1 = *(AMQP_VALUE *)(&((map->value).described_value.descriptor)->type + (ulong)index * 4);
      amqpvalue_clone(pAVar1);
      *key = pAVar1;
      if (pAVar1 == (AMQP_VALUE)0x0) {
        p_Var2 = xlogging_get_log_function();
        iVar4 = 0x6f0;
        if (p_Var2 == (LOGGER_LOG)0x0) {
          return 0x6f0;
        }
        pcVar5 = "Could not clone index %u key";
        iVar3 = 0x6ef;
      }
      else {
        pAVar1 = (&((map->value).described_value.descriptor)->value)[index].described_value.
                 descriptor;
        amqpvalue_clone(pAVar1);
        *value = pAVar1;
        if (pAVar1 != (AMQP_VALUE)0x0) {
          return 0;
        }
        amqpvalue_destroy(*key);
        p_Var2 = xlogging_get_log_function();
        iVar4 = 0x6fa;
        if (p_Var2 == (LOGGER_LOG)0x0) {
          return 0x6fa;
        }
        pcVar5 = "Could not clone index %u value";
        iVar3 = 0x6f9;
      }
    }
    else {
      p_Var2 = xlogging_get_log_function();
      iVar4 = 0x6e6;
      if (p_Var2 == (LOGGER_LOG)0x0) {
        return 0x6e6;
      }
      pcVar5 = "Index out of range: %u";
      iVar3 = 0x6e5;
    }
  }
  else {
    p_Var2 = xlogging_get_log_function();
    iVar4 = 0x6e0;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x6e0;
    }
    pcVar5 = "Value is not of type MAP";
    iVar3 = 0x6df;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
            ,"amqpvalue_get_map_key_value_pair",iVar3,1,pcVar5);
  return iVar4;
}

Assistant:

int amqpvalue_get_map_key_value_pair(AMQP_VALUE map, uint32_t index, AMQP_VALUE* key, AMQP_VALUE* value)
{
    int result;

    /* Codes_SRS_AMQPVALUE_01_201: [If any of the map, key or value arguments is NULL, amqpvalue_get_map_key_value_pair shall fail and return a non-zero value.] */
    if ((map == NULL) ||
        (key == NULL) ||
        (value == NULL))
    {
        LogError("Bad arguments: map = %p, key = %p, value = %p",
            map, key, value);
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE_DATA* value_data = (AMQP_VALUE_DATA*)map;

        if (value_data->type != AMQP_TYPE_MAP)
        {
            /* Codes_SRS_AMQPVALUE_01_205: [If the map argument is not an AMQP value created with the amqpvalue_create_map function then amqpvalue_get_map_key_value_pair shall fail and return a non-zero value.] */
            LogError("Value is not of type MAP");
            result = MU_FAILURE;
        }
        else if (value_data->value.map_value.pair_count <= index)
        {
            /* Codes_SRS_AMQPVALUE_01_204: [If the index argument is greater or equal to the number of key/value pairs in the map then amqpvalue_get_map_key_value_pair shall fail and return a non-zero value.] */
            LogError("Index out of range: %u", (unsigned int)index);
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_199: [amqpvalue_get_map_key_value_pair shall fill in the key and value arguments copies of the key/value pair on the 0 based position index in a map.] */
            *key = amqpvalue_clone(value_data->value.map_value.pairs[index].key);
            if (*key == NULL)
            {
                /* Codes_SRS_AMQPVALUE_01_202: [If cloning the key fails, amqpvalue_get_map_key_value_pair shall fail and return a non-zero value.] */
                LogError("Could not clone index %u key", (unsigned int)index);
                result = MU_FAILURE;
            }
            else
            {
                *value = amqpvalue_clone(value_data->value.map_value.pairs[index].value);
                if (*value == NULL)
                {
                    /* Codes_SRS_AMQPVALUE_01_203: [If cloning the value fails, amqpvalue_get_map_key_value_pair shall fail and return a non-zero value.] */
                    amqpvalue_destroy(*key);
                    LogError("Could not clone index %u value", (unsigned int)index);
                    result = MU_FAILURE;
                }
                else
                {
                    /* Codes_SRS_AMQPVALUE_01_200: [On success amqpvalue_get_map_key_value_pair shall return 0.] */
                    result = 0;
                }
            }
        }
    }

    return result;
}